

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.cpp
# Opt level: O0

void __thiscall
TransitionObservationIndependentMADPDiscrete::TransitionObservationIndependentMADPDiscrete
          (TransitionObservationIndependentMADPDiscrete *this,void **vtt,
          TransitionObservationIndependentMADPDiscrete *param_3)

{
  undefined8 uVar1;
  long *in_RSI;
  long *in_RDI;
  long *arg;
  allocator<char> *in_stack_fffffffffffffef0;
  E *this_00;
  char *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  string *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  string *in_stack_ffffffffffffff30;
  allocator<char> *vtt_00;
  MultiAgentDecisionProcess *this_01;
  allocator<char> local_99;
  string local_98 [39];
  undefined1 local_71 [56];
  allocator<char> local_39;
  string local_38 [56];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  this_01 = (MultiAgentDecisionProcess *)local_71;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  vtt_00 = &local_99;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  MultiAgentDecisionProcess::MultiAgentDecisionProcess
            (this_01,(void **)vtt_00,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
             in_stack_ffffffffffffff20);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator(&local_99);
  std::__cxx11::string::~string((string *)(local_71 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_71);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  *in_RDI = *in_RSI;
  *(long *)((long)in_RDI + *(long *)(*in_RDI + -0x40)) = in_RSI[3];
  *(long *)((long)in_RDI + *(long *)(*in_RDI + -0x48)) = in_RSI[4];
  std::
  vector<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
  ::vector((vector<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
            *)0xab4cee);
  std::vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>::vector
            ((vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_> *)0xab4d07);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)0xab4d20);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xab4d39);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xab4d52);
  arg = in_RDI + 0x2c;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xab4d6b);
  this_00 = (E *)(in_RDI + 0x2f);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xab4d84);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)0xab4d9d);
  std::vector<State_*,_std::allocator<State_*>_>::vector
            ((vector<State_*,_std::allocator<State_*>_> *)0xab4db6);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xab4dcf);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xab4de8);
  std::
  vector<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>,_std::allocator<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>_>
  ::vector((vector<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>,_std::allocator<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>_>
            *)0xab4e01);
  std::vector<JointObservationDiscrete_*,_std::allocator<JointObservationDiscrete_*>_>::vector
            ((vector<JointObservationDiscrete_*,_std::allocator<JointObservationDiscrete_*>_> *)
             0xab4e1a);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)0xab4e33);
  uVar1 = __cxa_allocate_exception(0x28);
  E::E(this_00,(char *)arg);
  __cxa_throw(uVar1,&E::typeinfo,E::~E);
}

Assistant:

TransitionObservationIndependentMADPDiscrete::
TransitionObservationIndependentMADPDiscrete(
    const TransitionObservationIndependentMADPDiscrete&)
{
    throw(E("TransitionObservationIndependentMADPDiscrete: copy ctor not implemented"));
}